

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pq_test.cpp
# Opt level: O0

void __thiscall
priorityQueueTest_random_large_Test::TestBody(priorityQueueTest_random_large_Test *this)

{
  double lhs_value;
  bool bVar1;
  const_reference pvVar2;
  T *pTVar3;
  char *pcVar4;
  AssertHelper local_1468;
  Message local_1460;
  size_t local_1458;
  size_type local_1450;
  undefined1 local_1448 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1430;
  Message local_1428;
  undefined1 local_1420 [8];
  AssertionResult gtest_ar;
  double num;
  undefined1 local_1400 [4];
  uint i;
  Priority_queue pq;
  priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> std_pq;
  uniform_real_distribution<double> dis;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13a0;
  default_random_engine e;
  random_device rand_dev;
  priorityQueueTest_random_large_Test *this_local;
  
  std::random_device::random_device((random_device *)&e);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_13a0,0x32a);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&std_pq.field_0x18,0.0,100.0);
  std::priority_queue<double,std::vector<double,std::allocator<double>>,std::less<double>>::
  priority_queue<std::vector<double,std::allocator<double>>,void>
            ((priority_queue<double,std::vector<double,std::allocator<double>>,std::less<double>> *)
             &pq.currentsize);
  Priority_queue::Priority_queue((Priority_queue *)local_1400);
  for (num._4_4_ = 0; num._4_4_ != 5000000; num._4_4_ = num._4_4_ + 1) {
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::uniform_real_distribution<double>::operator()
                   ((uniform_real_distribution<double> *)&std_pq.field_0x18,&local_13a0);
    std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
    push((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_> *
         )&pq.currentsize,(value_type *)&gtest_ar.message_);
    Priority_queue::push((Priority_queue *)local_1400,(T *)&gtest_ar.message_);
  }
  pvVar2 = std::
           priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
           ::top((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                  *)&pq.currentsize);
  lhs_value = *pvVar2;
  pTVar3 = Priority_queue::top((Priority_queue *)local_1400);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1420,"std_pq.top()","pq.top()",lhs_value,*pTVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1420);
  if (!bVar1) {
    testing::Message::Message(&local_1428);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1420);
    testing::internal::AssertHelper::AssertHelper
              (&local_1430,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
               ,0x35,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1430,&local_1428);
    testing::internal::AssertHelper::~AssertHelper(&local_1430);
    testing::Message::~Message(&local_1428);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1420);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_1450 = std::
                 priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                 ::size((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                         *)&pq.currentsize);
    local_1458 = Priority_queue::size((Priority_queue *)local_1400);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_1448,"std_pq.size()","pq.size()",&local_1450,&local_1458);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1448);
    if (!bVar1) {
      testing::Message::Message(&local_1460);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1448);
      testing::internal::AssertHelper::AssertHelper
                (&local_1468,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/zxc479773533[P]uniquelab-2017-summer-assignment-1/pq_test.cpp"
                 ,0x36,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1468,&local_1460);
      testing::internal::AssertHelper::~AssertHelper(&local_1468);
      testing::Message::~Message(&local_1460);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1448);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
  Priority_queue::~Priority_queue((Priority_queue *)local_1400);
  std::priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>::
  ~priority_queue((priority_queue<double,_std::vector<double,_std::allocator<double>_>,_std::less<double>_>
                   *)&pq.currentsize);
  std::random_device::~random_device((random_device *)&e);
  return;
}

Assistant:

TEST_F(priorityQueueTest,random_large) {
    std::random_device rand_dev;

    std::default_random_engine e(810);
    std::uniform_real_distribution<double> dis(0, 100);

    std::priority_queue<double> std_pq;
    Priority_queue pq;

    for (unsigned i = 0; i != 5000000; ++i) {
        double num = dis(e);
        std_pq.push(num);
        pq.push(num);
    }
    ASSERT_DOUBLE_EQ(std_pq.top(), pq.top());
    ASSERT_EQ(std_pq.size(), pq.size());
}